

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyDefinition.cpp
# Opt level: O0

bool __thiscall
Rml::PropertyDefinition::GetValue(PropertyDefinition *this,String *value,Property *property)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  PropertyParser *pPVar4;
  const_reference pvVar5;
  Unit *value_00;
  String local_120;
  String local_100;
  reference local_e0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *name_keyword;
  const_iterator __end3;
  const_iterator __begin3;
  ParameterMap *__range3;
  int local_a8;
  int keyword;
  int i;
  PropertyParser *local_80;
  PropertyParser *keyword_parser;
  int parser_index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  Property *local_28;
  Property *property_local;
  String *value_local;
  PropertyDefinition *this_local;
  
  local_28 = property;
  property_local = (Property *)value;
  value_local = (String *)this;
  ::std::__cxx11::string::string((string *)&local_68);
  Variant::Get<std::__cxx11::string>(&local_48,&property->value,&local_68);
  ::std::__cxx11::string::operator=((string *)property_local,(string *)&local_48);
  ::std::__cxx11::string::~string((string *)&local_48);
  ::std::__cxx11::string::~string((string *)&local_68);
  if (local_28->unit == KEYWORD) {
    iVar2 = local_28->parser_index;
    keyword_parser._0_4_ = iVar2;
    if ((iVar2 < 0) ||
       (sVar3 = ::std::
                vector<Rml::PropertyDefinition::ParserState,_std::allocator<Rml::PropertyDefinition::ParserState>_>
                ::size(&this->parsers), (int)sVar3 <= iVar2)) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&i,"keyword",(allocator<char> *)((long)&keyword + 3));
      pPVar4 = StyleSheetSpecification::GetParser((String *)&i);
      ::std::__cxx11::string::~string((string *)&i);
      ::std::allocator<char>::~allocator((allocator<char> *)((long)&keyword + 3));
      local_80 = pPVar4;
      for (local_a8 = 0;
          sVar3 = ::std::
                  vector<Rml::PropertyDefinition::ParserState,_std::allocator<Rml::PropertyDefinition::ParserState>_>
                  ::size(&this->parsers), local_a8 < (int)sVar3; local_a8 = local_a8 + 1) {
        pvVar5 = ::std::
                 vector<Rml::PropertyDefinition::ParserState,_std::allocator<Rml::PropertyDefinition::ParserState>_>
                 ::operator[](&this->parsers,(long)local_a8);
        if (pvVar5->parser == local_80) {
          keyword_parser._0_4_ = local_a8;
          break;
        }
      }
      iVar2 = (int)keyword_parser;
      if (((int)keyword_parser < 0) ||
         (sVar3 = ::std::
                  vector<Rml::PropertyDefinition::ParserState,_std::allocator<Rml::PropertyDefinition::ParserState>_>
                  ::size(&this->parsers), (int)sVar3 <= iVar2)) {
        return false;
      }
    }
    iVar2 = Variant::Get<int>(&local_28->value,0);
    pvVar5 = ::std::
             vector<Rml::PropertyDefinition::ParserState,_std::allocator<Rml::PropertyDefinition::ParserState>_>
             ::operator[](&this->parsers,(long)(int)keyword_parser);
    join_0x00000010_0x00000000_ =
         robin_hood::detail::
         Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&pvVar5->parameters);
    _name_keyword =
         robin_hood::detail::
         Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&pvVar5->parameters);
    while (bVar1 = robin_hood::detail::
                   Table<true,80ul,std::__cxx11::string,int,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                   ::Iter<true>::operator!=((Iter<true> *)&__end3.mInfo,(Iter<true> *)&name_keyword)
          , bVar1) {
      local_e0 = robin_hood::detail::
                 Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::Iter<true>::operator*((Iter<true> *)&__end3.mInfo);
      if (local_e0->second == iVar2) {
        ::std::__cxx11::string::operator=((string *)property_local,(string *)local_e0);
        break;
      }
      robin_hood::detail::
      Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::Iter<true>::operator++((Iter<true> *)&__end3.mInfo);
    }
    this_local._7_1_ = false;
  }
  else {
    value_00 = &local_28->unit;
    ::std::__cxx11::string::string((string *)&local_120);
    ToString<Rml::Unit>(&local_100,value_00,&local_120);
    ::std::__cxx11::string::operator+=((string *)property_local,(string *)&local_100);
    ::std::__cxx11::string::~string((string *)&local_100);
    ::std::__cxx11::string::~string((string *)&local_120);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool PropertyDefinition::GetValue(String& value, const Property& property) const
{
	value = property.value.Get<String>();

	switch (property.unit)
	{
	case Unit::KEYWORD:
	{
		int parser_index = property.parser_index;
		if (parser_index < 0 || parser_index >= (int)parsers.size())
		{
			// Look for the keyword parser in the property's list of parsers
			const auto* keyword_parser = StyleSheetSpecification::GetParser("keyword");
			for (int i = 0; i < (int)parsers.size(); i++)
			{
				if (parsers[i].parser == keyword_parser)
				{
					parser_index = i;
					break;
				}
			}
			// If we couldn't find it, exit now
			if (parser_index < 0 || parser_index >= (int)parsers.size())
				return false;
		}

		int keyword = property.value.Get<int>();
		for (const auto& name_keyword : parsers[parser_index].parameters)
		{
			if (name_keyword.second == keyword)
			{
				value = name_keyword.first;
				break;
			}
		}

		return false;
	}
	break;

	default: value += ToString(property.unit); break;
	}

	return true;
}